

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::VertexShaderTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,VertexShaderTestInstance *this,VkQueryPool queryPool)

{
  VkQueryPipelineStatisticFlags VVar1;
  bool bVar2;
  uint uVar3;
  VkResult result_00;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  VertexShaderTestInstance *local_50;
  ulong local_48;
  deUint64 expectedMax;
  deUint64 expectedMin;
  deUint64 result;
  VkDevice device;
  DeviceInterface *vk;
  VertexShaderTestInstance *this_local;
  VkQueryPool queryPool_local;
  
  vk = (DeviceInterface *)this;
  this_local = (VertexShaderTestInstance *)queryPool.m_internal;
  queryPool_local.m_internal = (deUint64)__return_storage_ptr__;
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  result = (deUint64)
           Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  expectedMin = 0;
  expectedMax = 0;
  local_48 = 0;
  VVar1 = ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->queryStatisticFlags;
  if (VVar1 == 1) {
    expectedMax = 0x10;
    local_48 = 0x10;
  }
  else if (VVar1 == 2) {
    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
        VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
      local_104 = 0x10;
    }
    else {
      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
          VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
        local_108 = 8;
      }
      else {
        if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
            VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
          local_10c = 0xf;
        }
        else {
          if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
              VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
            local_110 = 5;
          }
          else {
            if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
              local_114 = 8;
            }
            else {
              if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                  VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) {
                local_118 = 0xe;
              }
              else {
                if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology
                    == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY) {
                  local_11c = 4;
                }
                else {
                  if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                      primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY) {
                    local_120 = 0xd;
                  }
                  else {
                    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                        primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY) {
                      local_124 = 2;
                    }
                    else {
                      local_124 = 0;
                      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                          primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY)
                      {
                        local_124 = 6;
                      }
                    }
                    local_120 = local_124;
                  }
                  local_11c = local_120;
                }
                local_118 = local_11c;
              }
              local_114 = local_118;
            }
            local_110 = local_114;
          }
          local_10c = local_110;
        }
        local_108 = local_10c;
      }
      local_104 = local_108;
    }
    local_48 = (ulong)local_104;
    expectedMax = local_48;
  }
  else if (VVar1 == 4) {
    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
        VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      local_f4 = 0xf;
    }
    else {
      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
          VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY) {
        local_f8 = 8;
      }
      else {
        if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
            VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY) {
          local_fc = 0xe;
        }
        else {
          if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
              VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY) {
            local_100 = 6;
          }
          else {
            local_100 = 0x10;
            if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY) {
              local_100 = 8;
            }
          }
          local_fc = local_100;
        }
        local_f8 = local_fc;
      }
      local_f4 = local_f8;
    }
    expectedMax = (deUint64)local_f4;
    uVar3 = 0x10;
    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
        VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY) {
      uVar3 = 0xc;
    }
    local_48 = (ulong)uVar3;
  }
  else if (VVar1 == 0x80) {
    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
        VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
      local_128 = 9;
    }
    else {
      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
          VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
        local_12c = 0xc0;
      }
      else {
        if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
            VK_PRIMITIVE_TOPOLOGY_LINE_STRIP) {
          local_130 = 0x1c0;
        }
        else {
          if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
              VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
            local_134 = 0x7e0;
          }
          else {
            if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
              local_138 = 0x1000;
            }
            else {
              if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology ==
                  VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) {
                local_13c = 0x27e0;
              }
              else {
                if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology
                    == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY) {
                  local_140 = 0x80;
                }
                else {
                  if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                      primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY) {
                    local_144 = 0x1a0;
                  }
                  else {
                    if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                        primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY) {
                      local_148 = 0x3e0;
                    }
                    else {
                      local_148 = 0;
                      if (((this->super_GraphicBasicTestInstance).m_parametersGraphic)->
                          primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY)
                      {
                        local_148 = 0xc00;
                      }
                    }
                    local_144 = local_148;
                  }
                  local_140 = local_144;
                }
                local_13c = local_140;
              }
              local_138 = local_13c;
            }
            local_134 = local_138;
          }
          local_130 = local_134;
        }
        local_12c = local_130;
      }
      local_128 = local_12c;
    }
    expectedMax = (deUint64)local_128;
    local_48 = expectedMax << 2;
  }
  local_50 = this_local;
  result_00 = (**(code **)(*(long *)device + 0x100))
                        (device,result,this_local,0,1,8,&expectedMin,0,1);
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x451);
  if ((expectedMin < expectedMax) || (local_48 < expectedMin)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"QueryPoolResults incorrect",&local_71);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else if ((((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology !=
            VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) ||
          (bVar2 = GraphicBasicTestInstance::checkImage(&this->super_GraphicBasicTestInstance),
          bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Pass",&local_d1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Result image doesn\'t match expected image.",&local_a9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus VertexShaderTestInstance::checkResult (VkQueryPool queryPool)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	deUint64				result		= 0u;
	deUint64				expectedMin	= 0u;
	deUint64				expectedMax	= 0u;
	switch(m_parametersGraphic.queryStatisticFlags)
	{
		case VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT:
			expectedMax = expectedMin = 16u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT:
			expectedMin =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					? 15u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			?  8u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		? 14u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		?  6u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	?  8u :
							16u;
			expectedMax =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		? 12u : 16u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT:
			expectedMax = expectedMin =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST						? 16u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST						?  8u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP						? 15u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					?  5u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP					?  8u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN						? 14u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			?  4u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		? 13u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		?  2u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	?  6u :
										0u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT:
			expectedMin =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST						?     9u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST						?   192u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP						?   448u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					?  2016u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP					?  4096u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN						? 10208u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			?   128u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		?   416u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		?   992u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	?  3072u :
							0u;
			expectedMax = 4u * expectedMin;
			break;
		default:
			DE_ASSERT(0);
			break;
	}

	VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
	if (result < expectedMin || result > expectedMax)
		return tcu::TestStatus::fail("QueryPoolResults incorrect");

	if (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP && !checkImage())
		return tcu::TestStatus::fail("Result image doesn't match expected image.");

	return tcu::TestStatus::pass("Pass");
}